

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O2

QList<QAbstractButton_*> * __thiscall
QDialogButtonBoxPrivate::visibleButtons
          (QList<QAbstractButton_*> *__return_storage_ptr__,QDialogButtonBoxPrivate *this)

{
  int j;
  ulong uVar1;
  int i;
  long lVar2;
  
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QAbstractButton **)0x0;
  for (lVar2 = 0; lVar2 != 9; lVar2 = lVar2 + 1) {
    for (uVar1 = 0; uVar1 < (ulong)this->buttonLists[lVar2].d.size; uVar1 = uVar1 + 1) {
      QList<QAbstractButton_*>::append(__return_storage_ptr__,this->buttonLists[lVar2].d.ptr[uVar1])
      ;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QAbstractButton *> QDialogButtonBoxPrivate::visibleButtons() const
{
    QList<QAbstractButton *> finalList;
    for (int i = 0; i < QDialogButtonBox::NRoles; ++i) {
        const QList<QAbstractButton *> &list = buttonLists[i];
        for (int j = 0; j < list.size(); ++j)
            finalList.append(list.at(j));
    }
    return finalList;
}